

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_SimulateSop(Abc_Obj_t *pObj,char *pSop)

{
  Flow_Data_t *pFVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pObj_00;
  bool bVar6;
  int local_48;
  int local_44;
  int v;
  int dcOr;
  int dcAnd;
  int rVar;
  int rOr;
  int rAnd;
  int j;
  int i;
  char *pCube;
  Abc_Obj_t *pFanin;
  char *pSop_local;
  Abc_Obj_t *pObj_local;
  
  if ((pSop == (char *)0x0) || (iVar4 = Abc_SopIsExorType(pSop), iVar4 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x1ba,"void Abc_FlowRetime_SimulateSop(Abc_Obj_t *, char *)");
  }
  dcAnd = 0;
  local_44 = 0;
  iVar4 = Abc_SopGetVarNum(pSop);
  _j = pSop;
  do {
    if (*_j == '\0') {
      if (dcAnd != 0) {
        local_44 = 0;
      }
      iVar4 = Abc_SopGetPhase(pSop);
      if (iVar4 == 0) {
        dcAnd = dcAnd ^ 1;
      }
      Abc_FlowRetime_SetInitValue(pObj,dcAnd,local_44);
      return;
    }
    rVar = 1;
    bVar3 = false;
    rOr = 0;
    while( true ) {
      bVar6 = false;
      if (_j[rOr] != ' ') {
        local_48 = (int)_j[rOr];
        bVar6 = local_48 != 0;
      }
      if (!bVar6) break;
      pObj_00 = Abc_ObjFanin(pObj,rOr);
      if (local_48 == 0x30) {
        pFVar1 = pManMR->pDataArray;
        uVar5 = Abc_ObjId(pObj_00);
        uVar2 = *(ushort *)(pFVar1 + uVar5) & 0x20;
LAB_005ed898:
        dcOr = (int)(uVar2 != 0);
        pFVar1 = pManMR->pDataArray;
        uVar5 = Abc_ObjId(pObj_00);
        if ((undefined1  [24])((undefined1  [24])pFVar1[uVar5] & (undefined1  [24])0x60) ==
            (undefined1  [24])0x0) {
          bVar3 = true;
        }
        else {
          rVar = dcOr & rVar;
        }
      }
      else if (local_48 == 0x31) {
        pFVar1 = pManMR->pDataArray;
        uVar5 = Abc_ObjId(pObj_00);
        uVar2 = *(ushort *)(pFVar1 + uVar5) & 0x40;
        goto LAB_005ed898;
      }
      rOr = rOr + 1;
    }
    if (rVar == 0) {
      bVar3 = false;
    }
    if (bVar3) {
      local_44 = 1;
    }
    else {
      dcAnd = rVar | dcAnd;
    }
    _j = _j + (iVar4 + 3);
  } while( true );
}

Assistant:

void Abc_FlowRetime_SimulateSop( Abc_Obj_t * pObj, char *pSop ) {
  Abc_Obj_t * pFanin;
  char *pCube;
  int i, j, rAnd, rOr, rVar, dcAnd, dcOr, v;

  assert( pSop && !Abc_SopIsExorType(pSop) );
      
  rOr = 0, dcOr = 0;

  i = Abc_SopGetVarNum(pSop);
  Abc_SopForEachCube( pSop, i, pCube ) {
    rAnd = 1, dcAnd = 0;
    Abc_CubeForEachVar( pCube, v, j ) {
      pFanin = Abc_ObjFanin(pObj, j);
      if ( v == '0' )
        rVar = FTEST(pFanin, INIT_0) ? 1 : 0;
      else if ( v == '1' )
        rVar = FTEST(pFanin, INIT_1) ? 1 : 0;
      else
        continue;
      
      if (FTEST(pFanin, INIT_CARE))
        rAnd &= rVar;
      else
        dcAnd = 1;
    }
    if (!rAnd) dcAnd = 0; /* controlling value */
    if (dcAnd) 
      dcOr = 1;
    else
      rOr |= rAnd;
  }
  if (rOr) dcOr = 0; /* controlling value */
  
  // complement the result if necessary
  if ( !Abc_SopGetPhase(pSop) )
    rOr ^= 1;
      
  Abc_FlowRetime_SetInitValue(pObj, rOr, dcOr);
}